

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cl_half.h
# Opt level: O0

cl_half cl_half_from_float(cl_float f,cl_half_rounding_mode rounding_mode)

{
  short sVar1;
  uint16_t sign_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t mask;
  uint32_t halfway;
  uint16_t h_mant;
  uint16_t h_mant_1;
  uint32_t lsb_pos;
  uint uStack_24;
  uint16_t h_exp;
  int32_t exp;
  uint32_t f_mant;
  uint32_t f_exp;
  uint16_t sign;
  anon_union_4_2_947300a4 f32;
  cl_half_rounding_mode rounding_mode_local;
  cl_float f_local;
  
  sVar1 = (short)((int)f >> 0x1f);
  sign_00 = -sVar1;
  uVar2 = (uint)f >> 0x17 & 0xff;
  uStack_24 = (uint)f & 0x7fffff;
  iVar3 = uVar2 - 0x7f;
  h_mant_1 = (short)iVar3 + 0xf;
  halfway._0_1_ = 0xd;
  if (uVar2 == 0xff) {
    if (uStack_24 == 0) {
      rounding_mode_local._2_2_ = sVar1 * -0x8000 | 0x7c00;
    }
    else {
      rounding_mode_local._2_2_ = sVar1 * -0x8000 | 0x7c00 | (short)(uStack_24 >> 0xd) | 0x200;
    }
  }
  else if ((uVar2 == 0) && (uStack_24 == 0)) {
    rounding_mode_local._2_2_ = sVar1 * -0x8000;
  }
  else if (iVar3 < 0x10) {
    if (iVar3 < -0x19) {
      rounding_mode_local._2_2_ = cl_half_handle_underflow(rounding_mode,sign_00);
    }
    else {
      if (iVar3 < -0xe) {
        h_mant_1 = 0;
        uStack_24 = uStack_24 | 0x800000;
        halfway._0_1_ = 0xff - (char)iVar3;
      }
      uVar4 = uStack_24 >> ((byte)halfway & 0x1f);
      mask._0_2_ = (undefined2)uVar4;
      uVar5 = 1 << ((byte)halfway - 1 & 0x1f);
      uVar2 = uVar5 * 2 - 1;
      switch(rounding_mode) {
      case CL_HALF_RTE:
        if (uVar5 < (uStack_24 & uVar2)) {
          mask._0_2_ = (undefined2)mask + 1;
        }
        else if (((uStack_24 & uVar2) == uVar5) && ((uVar4 & 1) != 0)) {
          mask._0_2_ = (undefined2)mask + 1;
        }
        break;
      case CL_HALF_RTZ:
        break;
      case CL_HALF_RTP:
        if (((uStack_24 & uVar2) != 0) && (sign_00 == 0)) {
          mask._0_2_ = (undefined2)mask + 1;
        }
        break;
      case CL_HALF_RTN:
        if (((uStack_24 & uVar2) != 0) && (sign_00 != 0)) {
          mask._0_2_ = (undefined2)mask + 1;
        }
      }
      if (((undefined2)mask & 0x400) != CL_HALF_RTE >> 0x10) {
        h_mant_1 = h_mant_1 + 1;
        mask._0_2_ = CL_HALF_RTE >> 0x10;
      }
      rounding_mode_local._2_2_ = sVar1 * -0x8000 | h_mant_1 << 10 | (undefined2)mask;
    }
  }
  else {
    rounding_mode_local._2_2_ = cl_half_handle_overflow(rounding_mode,sign_00);
  }
  return rounding_mode_local._2_2_;
}

Assistant:

static inline cl_half cl_half_from_float(cl_float f, cl_half_rounding_mode rounding_mode)
{
  // Type-punning to get direct access to underlying bits
  union
  {
    cl_float f;
    uint32_t i;
  } f32;
  f32.f = f;

  // Extract sign bit
  uint16_t sign = f32.i >> 31;

  // Extract FP32 exponent and mantissa
  uint32_t f_exp = (f32.i >> (CL_FLT_MANT_DIG - 1)) & 0xFF;
  uint32_t f_mant = f32.i & ((1 << (CL_FLT_MANT_DIG - 1)) - 1);

  // Remove FP32 exponent bias
  int32_t exp = f_exp - CL_FLT_MAX_EXP + 1;

  // Add FP16 exponent bias
  uint16_t h_exp = (uint16_t)(exp + CL_HALF_MAX_EXP - 1);

  // Position of the bit that will become the FP16 mantissa LSB
  uint32_t lsb_pos = CL_FLT_MANT_DIG - CL_HALF_MANT_DIG;

  // Check for NaN / infinity
  if (f_exp == 0xFF)
  {
    if (f_mant)
    {
      // NaN -> propagate mantissa and silence it
      uint16_t h_mant = (uint16_t)(f_mant >> lsb_pos);
      h_mant |= 0x200;
      return (sign << 15) | CL_HALF_EXP_MASK | h_mant;
    }
    else
    {
      // Infinity -> zero mantissa
      return (sign << 15) | CL_HALF_EXP_MASK;
    }
  }

  // Check for zero
  if (!f_exp && !f_mant)
  {
    return (sign << 15);
  }

  // Check for overflow
  if (exp >= CL_HALF_MAX_EXP)
  {
    return cl_half_handle_overflow(rounding_mode, sign);
  }

  // Check for underflow
  if (exp < (CL_HALF_MIN_EXP - CL_HALF_MANT_DIG - 1))
  {
    return cl_half_handle_underflow(rounding_mode, sign);
  }

  // Check for value that will become denormal
  if (exp < -14)
  {
    // Denormal -> include the implicit 1 from the FP32 mantissa
    h_exp = 0;
    f_mant |= 1 << (CL_FLT_MANT_DIG - 1);

    // Mantissa shift amount depends on exponent
    lsb_pos = -exp + (CL_FLT_MANT_DIG - 25);
  }

  // Generate FP16 mantissa by shifting FP32 mantissa
  uint16_t h_mant = (uint16_t)(f_mant >> lsb_pos);

  // Check whether we need to round
  uint32_t halfway = 1 << (lsb_pos - 1);
  uint32_t mask = (halfway << 1) - 1;
  switch (rounding_mode)
  {
    case CL_HALF_RTE:
      if ((f_mant & mask) > halfway)
      {
        // More than halfway -> round up
        h_mant += 1;
      }
      else if ((f_mant & mask) == halfway)
      {
        // Exactly halfway -> round to nearest even
        if (h_mant & 0x1)
          h_mant += 1;
      }
      break;
    case CL_HALF_RTZ:
      // Mantissa has already been truncated -> do nothing
      break;
    case CL_HALF_RTP:
      if ((f_mant & mask) && !sign)
      {
        // Round positive numbers up
        h_mant += 1;
      }
      break;
    case CL_HALF_RTN:
      if ((f_mant & mask) && sign)
      {
        // Round negative numbers down
        h_mant += 1;
      }
      break;
  }

  // Check for mantissa overflow
  if (h_mant & 0x400)
  {
    h_exp += 1;
    h_mant = 0;
  }

  return (sign << 15) | (h_exp << 10) | h_mant;
}